

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

void crnlib::dxt_fast::compress_color_block
               (uint n,color_quad_u8 *block,uint *low16,uint *high16,uint8 *pSelectors,bool refine)

{
  byte bVar1;
  byte bVar2;
  color_quad_u8 cVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  bool bVar20;
  uint16 uVar21;
  uint i_5;
  uint uVar22;
  uint uVar23;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar24;
  ulong uVar25;
  uint64 uVar26;
  uint64 uVar27;
  bool bVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  uint j;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  uint i_4;
  undefined1 *puVar41;
  uint i_6;
  int iVar42;
  color_quad_u8 *pcVar43;
  bool bVar44;
  ushort uVar45;
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  double dVar51;
  undefined1 auVar50 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  int iVar64;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_218;
  int local_214;
  uint local_210;
  uint local_20c;
  undefined1 *local_208;
  ulong local_200;
  uint64 local_1f8;
  uint c;
  int max [3];
  uint local_1c8;
  undefined1 auStack_1c4 [12];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1b0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1ac;
  color_quad_u8 color [4];
  int min [3];
  uint ave_color [3];
  vec3F probe_high_color;
  vec3F probe_low_color;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_140;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_120;
  vec<3U,_float> local_118;
  vec<3U,_float> local_108;
  vec3F initial_ofs;
  vec3F scaled_principle_axis;
  uint probe_low [17];
  double covf [6];
  vec<3U,_float> local_40;
  
  auVar50 = _local_1c8;
  uVar34 = (ulong)n;
  pcVar43 = block;
  for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
    uVar25 = (ulong)(block->field_0).c[lVar37];
    uVar32 = (uint)(block->field_0).c[lVar37];
    uVar23 = uVar32;
    for (uVar33 = 4; uVar33 < n * 4; uVar33 = uVar33 + 4) {
      bVar1 = (pcVar43->field_0).c[uVar33];
      uVar25 = uVar25 + bVar1;
      uVar29 = (uint)bVar1;
      if (bVar1 <= uVar23) {
        uVar23 = uVar29;
      }
      if (uVar29 < uVar32) {
        uVar29 = uVar32;
      }
      uVar32 = uVar29;
    }
    ave_color[lVar37] = (uint)((uVar25 + (n >> 1)) / uVar34);
    min[lVar37] = uVar23;
    max[lVar37] = uVar32;
    pcVar43 = (color_quad_u8 *)((long)&pcVar43->field_0 + 1);
  }
  if (((min[0] != max[0]) || (min[1] != max[1])) || (min[2] != max[2])) {
    for (lVar37 = 0; lVar37 != 6; lVar37 = lVar37 + 1) {
      (probe_low + lVar37 * 2)[0] = 0;
      (probe_low + lVar37 * 2)[1] = 0;
    }
    for (uVar33 = 0; uVar34 != uVar33; uVar33 = uVar33 + 1) {
      iVar36 = block[uVar33].field_0.field_0.b - ave_color[2];
      dVar54 = (double)iVar36;
      cVar3.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
            &block[uVar33].field_0.field_0;
      uVar25 = (ulong)cVar3.field_0._0_2_ & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar25;
      auVar5[0xc] = cVar3.field_0._3_1_;
      auVar6[8] = cVar3.field_0._2_1_;
      auVar6._0_8_ = uVar25;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar12._5_8_ = 0;
      auVar12._0_5_ = auVar6._8_5_;
      auVar7[4] = cVar3.field_0._1_1_;
      auVar7._0_4_ = (int)uVar25;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar12 << 0x40,6);
      dVar55 = (double)(int)((int)uVar25 - (uint)ave_color._0_8_);
      dVar57 = (double)(int)(auVar7._4_4_ - SUB84(ave_color._0_8_,4));
      probe_low._0_8_ = (double)probe_low._0_8_ + dVar55 * dVar55;
      probe_low._8_8_ = (double)probe_low._8_8_ + dVar55 * dVar57;
      probe_low._16_8_ = (double)probe_low._16_8_ + (double)iVar36 * dVar55;
      probe_low._24_8_ = (double)probe_low._24_8_ + dVar57 * dVar57;
      probe_low._32_8_ = (double)probe_low._32_8_ + dVar54 * dVar57;
      probe_low._40_8_ = (double)probe_low._40_8_ + dVar54 * dVar54;
    }
    for (lVar37 = 0; lVar37 != 6; lVar37 = lVar37 + 1) {
      covf[lVar37] = *(double *)(probe_low + lVar37 * 2) * 0.003921568859368563;
    }
    dVar57 = (double)(max[2] - min[2]);
    iVar36 = 4;
    dVar54 = (double)(max[0] - min[0]);
    dVar55 = (double)(max[1] - min[1]);
    while (bVar44 = iVar36 != 0, iVar36 = iVar36 + -1, bVar44) {
      dVar60 = dVar54 * covf[1];
      dVar58 = dVar57 * covf[2];
      dVar61 = dVar57 * covf[4];
      dVar57 = dVar57 * covf[5] + covf[2] * dVar54 + dVar55 * covf[4];
      dVar54 = dVar58 + dVar55 * covf[1] + dVar54 * covf[0];
      dVar55 = dVar61 + dVar55 * covf[3] + dVar60;
    }
    dVar58 = ABS(dVar54);
    if (ABS(dVar54) <= ABS(dVar55)) {
      dVar58 = ABS(dVar55);
    }
    if (dVar58 <= ABS(dVar57)) {
      dVar58 = ABS(dVar57);
    }
    if (4.0 <= dVar58) {
      dVar58 = 512.0 / dVar58;
      iVar64 = (int)(dVar54 * dVar58);
      iVar39 = (int)(dVar55 * dVar58);
      iVar36 = (int)(dVar57 * dVar58);
      local_138 = CONCAT44((float)(dVar55 * dVar58),(float)(dVar54 * dVar58));
      fVar48 = (float)(dVar57 * dVar58);
    }
    else {
      iVar64 = 0x94;
      iVar39 = 300;
      local_138 = 0x4396000043140000;
      iVar36 = 0x3a;
      fVar48 = 58.0;
    }
    uStack_130 = 0;
    local_200 = CONCAT44(local_200._4_4_,fVar48);
    bVar1 = (block->field_0).field_0.r;
    uVar29 = (uint)bVar1;
    color[0].field_0._1_1_ = (block->field_0).field_0.g;
    local_1c8._1_3_ = 0;
    local_1c8._0_1_ = color[0].field_0._1_1_;
    bVar2 = (block->field_0).field_0.b;
    uVar23 = (uint)bVar2;
    iVar42 = uVar23 * iVar36 + uVar29 * iVar64 + (uint)(byte)color[0].field_0._1_1_ * iVar39;
    local_218.field_0.a = (block->field_0).field_0.a;
    local_208 = (undefined1 *)CONCAT71(local_208._1_7_,local_218.field_0.a);
    local_1f8 = CONCAT71(local_1f8._1_7_,bVar2);
    auStack_1c4 = auVar50._4_12_;
    uVar32 = (uint)bVar1;
    iVar40 = iVar42;
    for (uVar33 = 1; auVar50 = _local_1c8, uVar33 < uVar34; uVar33 = uVar33 + 1) {
      bVar1 = block[uVar33].field_0.field_0.r;
      local_1c8._0_1_ = block[uVar33].field_0.field_0.g;
      local_1c8._1_3_ = 0;
      bVar2 = block[uVar33].field_0.field_0.b;
      iVar38 = (uint)bVar2 * iVar36 + (uint)(byte)local_1c8 * iVar39 + (uint)bVar1 * iVar64;
      if (iVar38 < iVar42) {
        local_208 = (undefined1 *)CONCAT71(local_208._1_7_,block[uVar33].field_0.field_0.a);
        local_1f8 = CONCAT71(local_1f8._1_7_,bVar2);
        uVar29 = (uint)bVar1;
        iVar42 = iVar38;
        color[0].field_0._1_1_ = (byte)local_1c8;
      }
      if (iVar40 < iVar38) {
        local_218.field_0.a = block[uVar33].field_0.field_0.a;
        auStack_1c4 = auVar50._4_12_;
        auVar50 = _local_1c8;
        iVar40 = iVar38;
        uVar23 = (uint)bVar2;
        uVar32 = (uint)bVar1;
      }
      _local_1c8 = auVar50;
    }
    color[0].field_0._0_1_ = (undefined1)uVar29;
    color[0].field_0.field_0.b = (uchar)local_1f8;
    color[0].field_0.field_0.a = (uchar)local_208;
    local_218.field_0.r = (uchar)uVar32;
    local_218.field_0.g = (char)local_1c8;
    local_218.field_0.b = (char)uVar23;
    uVar22 = pack_color((color_quad_u8 *)&local_218.field_0);
    *low16 = uVar22;
    uVar22 = pack_color(color);
    *high16 = uVar22;
    bVar44 = determine_selectors(n,block,*low16,uVar22,pSelectors);
    if (bVar44) {
      dVar60 = 0.0;
      dVar57 = 0.0;
      dVar58 = 0.0;
      dVar54 = 0.0;
      dVar55 = 0.0;
      dVar61 = 0.0;
      dVar51 = 0.0;
      dVar52 = 0.0;
      dVar53 = 0.0;
      for (uVar33 = 0; uVar34 != uVar33; uVar33 = uVar33 + 1) {
        cVar3.field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
              &block[uVar33].field_0.field_0;
        dVar56 = (double)block[uVar33].field_0.field_0.b;
        bVar1 = pSelectors[uVar33];
        dVar61 = dVar61 + (double)dxt1_endpoint_optimizer::refine_solution::prods_1[bVar1];
        dVar51 = dVar51 + (double)dxt1_endpoint_optimizer::refine_solution::prods_0[bVar1];
        dVar62 = (double)dxt1_endpoint_optimizer::refine_solution::w1Tab[bVar1];
        uVar25 = (ulong)cVar3.field_0._0_2_ & 0xffffffffffff00ff;
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar25;
        auVar8[0xc] = cVar3.field_0._3_1_;
        auVar9[8] = cVar3.field_0._2_1_;
        auVar9._0_8_ = uVar25;
        auVar9[9] = 0;
        auVar9._10_3_ = auVar8._10_3_;
        auVar13._5_8_ = 0;
        auVar13._0_5_ = auVar9._8_5_;
        auVar10[4] = cVar3.field_0._1_1_;
        auVar10._0_4_ = (int)uVar25;
        auVar10[5] = 0;
        auVar10._6_7_ = SUB137(auVar13 << 0x40,6);
        dVar59 = (double)(int)uVar25;
        dVar60 = dVar60 + dVar56;
        dVar57 = dVar57 + dVar62 * dVar59;
        dVar58 = dVar58 + dVar62 * (double)auVar10._4_4_;
        dVar52 = dVar52 + dVar56 * dVar62;
        dVar53 = dVar53 + (double)dxt1_endpoint_optimizer::refine_solution::prods_2[bVar1];
        dVar54 = dVar54 + dVar59;
        dVar55 = dVar55 + (double)auVar10._4_4_;
      }
      if ((((dVar61 != 0.0) || (NAN(dVar61))) && ((dVar53 != 0.0 || (NAN(dVar53))))) &&
         (dVar56 = dVar53 * dVar61 - dVar51 * dVar51, 1.249999968422344e-05 <= ABS(dVar56))) {
        dVar60 = dVar60 * 3.0 - dVar52;
        dVar56 = 0.364705890417099 / dVar56;
        uVar23 = *high16;
        uVar22 = *low16;
        dVar54 = dVar54 * 3.0 - dVar57;
        dVar55 = dVar55 * 3.0 - dVar58;
        iVar36 = (int)((dVar61 * dVar57 - dVar54 * dVar51) * dVar56 + 0.5);
        iVar64 = (int)((dVar61 * dVar58 - dVar55 * dVar51) * dVar56 * 2.0322580337524414 + 0.5);
        auVar50 = ZEXT816(0x3f0000001f);
        auVar65._0_8_ = CONCAT44(-(uint)(iVar64 < auVar50._4_4_),-(uint)(iVar36 < auVar50._0_4_));
        auVar65._8_8_ = 0;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = CONCAT44(iVar64,iVar36) & auVar65._0_8_;
        auVar63 = ~auVar65 & auVar50 | auVar63;
        auVar66._0_4_ = -(uint)(0 < auVar63._0_4_);
        auVar66._4_4_ = -(uint)(0 < auVar63._4_4_);
        auVar66._8_4_ = -(uint)(0 < auVar63._8_4_);
        auVar66._12_4_ = -(uint)(0 < auVar63._12_4_);
        uVar32 = (uint)((dVar52 * dVar61 - dVar60 * dVar51) * dVar56 + 0.5);
        if (0x1e < (int)uVar32) {
          uVar32 = 0x1f;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        *low16 = SUB164(auVar66 & auVar63,4) << 5 | SUB164(auVar66 & auVar63,0) << 0xb | uVar32;
        iVar36 = (int)((dVar54 * dVar53 - dVar51 * dVar57) * dVar56 + 0.5);
        iVar64 = (int)((dVar55 * dVar53 - dVar51 * dVar58) * dVar56 * 2.0322580337524414 + 0.5);
        auVar49._0_8_ = CONCAT44(-(uint)(iVar64 < auVar50._4_4_),-(uint)(iVar36 < auVar50._0_4_));
        auVar49._8_8_ = 0;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = CONCAT44(iVar64,iVar36) & auVar49._0_8_;
        auVar47 = ~auVar49 & auVar50 | auVar47;
        auVar50._0_4_ = -(uint)(0 < auVar47._0_4_);
        auVar50._4_4_ = -(uint)(0 < auVar47._4_4_);
        auVar50._8_4_ = -(uint)(0 < auVar47._8_4_);
        auVar50._12_4_ = -(uint)(0 < auVar47._12_4_);
        uVar32 = (uint)((dVar60 * dVar53 - dVar51 * dVar52) * dVar56 + 0.5);
        if (0x1e < (int)uVar32) {
          uVar32 = 0x1f;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        uVar32 = SUB164(auVar50 & auVar47,4) << 5 | SUB164(auVar50 & auVar47,0) << 0xb | uVar32;
        *high16 = uVar32;
        if ((uVar23 != uVar32) || (uVar22 != *low16)) {
          determine_selectors(n,block,*low16,uVar32,pSelectors);
        }
      }
      if ((refine) &&
         (local_1f8 = determine_error(n,block,*low16,*high16,0xffffffffffffffff), local_1f8 != 0)) {
        fVar48 = 1.0 / SQRT((float)local_200 * (float)local_200 +
                            local_138._4_4_ * local_138._4_4_ + (float)local_138 * (float)local_138)
        ;
        local_40.m_s[2] = (float)local_200 * fVar48;
        local_40.m_s[0] = fVar48 * (float)local_138;
        local_40.m_s[1] = fVar48 * local_138._4_4_;
        operator*(&local_40,0.027063293);
        fVar48 = scaled_principle_axis.m_s[1];
        scaled_principle_axis.m_s[0] = scaled_principle_axis.m_s[0] * 31.0;
        scaled_principle_axis.m_s[1] = fVar48 * 63.0;
        scaled_principle_axis.m_s[2] = scaled_principle_axis.m_s[2] * 31.0;
        operator*(&scaled_principle_axis,-8.0);
        fVar48 = initial_ofs.m_s[1];
        initial_ofs.m_s[0] = initial_ofs.m_s[0] + 0.5;
        initial_ofs.m_s[1] = fVar48 + 0.5;
        initial_ofs.m_s[2] = initial_ofs.m_s[2] + 0.5;
        local_120 = uVar34;
        for (local_200 = 0; (int)local_200 != 4; local_200 = (ulong)((int)local_200 + 1)) {
          dxt1_block::unpack_color((dxt1_block *)min,(uint16)*low16,false,0xff);
          iVar36 = min[0];
          bVar1 = min[0]._2_1_;
          uVar23 = (uint)min[0]._2_1_;
          dxt1_block::unpack_color((dxt1_block *)min,(uint16)*high16,false,0xff);
          Var14 = CONCAT81(SUB158(ZEXT815(0),7),(char)((uint)iVar36 >> 0x18));
          auVar18._9_6_ = 0;
          auVar18._0_9_ = Var14;
          auVar15._1_10_ = SUB1510(auVar18 << 0x30,5);
          auVar15[0] = bVar1;
          auVar19._11_4_ = 0;
          auVar19._0_11_ = auVar15;
          auVar16._1_12_ = SUB1512(auVar19 << 0x20,3);
          auVar16[0] = (char)((uint)iVar36 >> 8);
          uVar45 = CONCAT11(0,(byte)iVar36);
          auVar11._2_13_ = auVar16;
          auVar11._0_2_ = uVar45;
          auVar4._10_2_ = 0;
          auVar4._0_10_ = auVar11._0_10_;
          auVar4._12_2_ = (short)Var14;
          auVar17._2_4_ = auVar4._10_4_;
          auVar17._0_2_ = auVar15._0_2_;
          auVar17._6_8_ = 0;
          local_108.m_s[0] = (float)uVar45;
          local_108.m_s[1] = (float)(int)CONCAT82(SUB148(auVar17 << 0x40,6),auVar16._0_2_);
          local_118.m_s[2] = (float)((uint)min[0] >> 0x10 & 0xff);
          local_118.m_s[0] = (float)(min[0] & 0xff);
          local_118.m_s[1] = (float)((uint)min[0] >> 8 & 0xff);
          local_108.m_s[2] = (float)uVar23;
          operator+(&local_108,&initial_ofs);
          for (lVar37 = 0; fVar48 = probe_low_color.m_s[1], lVar37 != 0x11; lVar37 = lVar37 + 1) {
            fVar46 = floorf(probe_low_color.m_s[0]);
            iVar36 = (int)fVar46;
            if (0x1e < iVar36) {
              iVar36 = 0x1f;
            }
            if (iVar36 < 1) {
              iVar36 = 0;
            }
            fVar48 = floorf(fVar48);
            iVar64 = (int)fVar48;
            if (0x3e < iVar64) {
              iVar64 = 0x3f;
            }
            if (iVar64 < 1) {
              iVar64 = 0;
            }
            fVar48 = floorf(probe_low_color.m_s[2]);
            uVar23 = (uint)fVar48;
            if (0x1e < (int)uVar23) {
              uVar23 = 0x1f;
            }
            if ((int)uVar23 < 1) {
              uVar23 = 0;
            }
            probe_low[lVar37] = iVar36 << 0xb | iVar64 << 5 | uVar23;
            vec<3U,_float>::operator+=(&probe_low_color,&scaled_principle_axis);
          }
          operator+(&local_118,&initial_ofs);
          for (lVar37 = 0; fVar48 = probe_high_color.m_s[1], lVar37 != 0x11; lVar37 = lVar37 + 1) {
            fVar46 = floorf(probe_high_color.m_s[0]);
            iVar36 = (int)fVar46;
            if (0x1e < iVar36) {
              iVar36 = 0x1f;
            }
            if (iVar36 < 1) {
              iVar36 = 0;
            }
            fVar48 = floorf(fVar48);
            iVar64 = (int)fVar48;
            if (0x3e < iVar64) {
              iVar64 = 0x3f;
            }
            if (iVar64 < 1) {
              iVar64 = 0;
            }
            fVar48 = floorf(probe_high_color.m_s[2]);
            uVar23 = (uint)fVar48;
            if (0x1e < (int)uVar23) {
              uVar23 = 0x1f;
            }
            if ((int)uVar23 < 1) {
              uVar23 = 0;
            }
            *(uint *)((long)covf + lVar37 * 4) = iVar36 << 0xb | iVar64 << 5 | uVar23;
            vec<3U,_float>::operator+=(&probe_high_color,&scaled_principle_axis);
          }
          uVar23 = *low16;
          uVar22 = *high16;
          for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
            (min + lVar37 * 2)[0] = 0;
            (min + lVar37 * 2)[1] = 0;
          }
          c = uVar22 << 0x10 | uVar23;
          c = fast_hash(&c,4);
          *(long *)((long)min + (ulong)(c >> 3 & 0x18)) = 1L << ((byte)c & 0x3f);
          for (lVar37 = 0; lVar37 != 0x11; lVar37 = lVar37 + 1) {
            uVar32 = probe_low[lVar37];
            for (lVar35 = 0; lVar35 != 0x11; lVar35 = lVar35 + 1) {
              uVar29 = *(uint *)((long)covf + lVar35 * 4);
              uVar30 = uVar29;
              if (uVar32 >= uVar29 && uVar32 != uVar29) {
                uVar30 = uVar32;
              }
              if (uVar32 < uVar29) {
                uVar29 = uVar32;
              }
              max[0] = uVar29 << 0x10 | uVar30;
              max[0] = fast_hash(max,4);
              uVar27 = local_1f8;
              uVar33 = (ulong)((uint)max[0] >> 6 & 3);
              if ((*(ulong *)(min + uVar33 * 2) >> ((ulong)(uint)max[0] & 0x3f) & 1) == 0) {
                *(ulong *)(min + uVar33 * 2) =
                     1L << ((byte)max[0] & 0x3f) | *(ulong *)(min + uVar33 * 2);
                local_208 = (undefined1 *)CONCAT44(local_208._4_4_,uVar30);
                uVar26 = determine_error(n,block,uVar30,uVar29,local_1f8);
                if (uVar26 < uVar27) {
                  uVar27 = uVar26;
                  uVar23 = (uint)local_208;
                  uVar22 = uVar29;
                }
                local_1f8 = uVar27;
              }
            }
          }
          local_138 = CONCAT71(local_138._1_7_,*high16 != uVar22 || *low16 != uVar23);
          if (*high16 != uVar22 || *low16 != uVar23) {
            *low16 = uVar23;
            *high16 = uVar22;
            determine_selectors(n,block,*low16,uVar22,pSelectors);
          }
          iVar36 = 0;
          bVar44 = false;
          do {
            bVar20 = bVar44;
            if (iVar36 == 2) break;
            uVar22 = *low16;
            eval_colors(color,uVar22,*high16);
            register0x00000030 = 0;
            max._0_8_ = 0;
            for (uVar33 = 0; uVar34 != uVar33; uVar33 = uVar33 + 1) {
              iVar64 = (uint)block[uVar33].field_0.field_0.r -
                       (uint)color[pSelectors[uVar33]].field_0.field_0.r;
              max._0_8_ = max._0_8_ + (ulong)(uint)(iVar64 * iVar64);
              iVar64 = (uint)block[uVar33].field_0.field_0.g -
                       (uint)color[pSelectors[uVar33]].field_0.field_0.g;
              register0x00000030 = register0x00000030 + (ulong)(uint)(iVar64 * iVar64);
            }
            dxt1_block::unpack_color((dxt1_block *)&local_218.field_0,(uint16)uVar22,false,0xff);
            local_1b0 = local_218;
            dxt1_block::unpack_color((dxt1_block *)&local_218.field_0,(uint16)*high16,false,0xff);
            local_1ac = local_218;
            dxt1_block::unpack_color((dxt1_block *)&local_218.field_0,(uint16)*low16,true,0xff);
            local_140 = local_218;
            dxt1_block::unpack_color((dxt1_block *)&local_218.field_0,(uint16)*high16,true,0xff);
            local_13c = local_218;
            bVar28 = false;
            pcVar43 = block;
            for (lVar37 = 0; lVar37 != 3; lVar37 = lVar37 + 1) {
              if (*(long *)(max + lVar37 * 2) != 0) {
                puVar41 = &ryg_dxt::Expand5;
                if (lVar37 == 1) {
                  puVar41 = &ryg_dxt::Expand6;
                }
                local_208 = puVar41;
                for (lVar35 = 0; lVar35 != 2; lVar35 = lVar35 + 1) {
                  uVar33 = lVar35 * 4 ^ 4;
                  *(uint *)((long)&local_218 + uVar33) = (uint)local_140.c[uVar33 + lVar37];
                  for (iVar64 = -1; iVar64 < 2; iVar64 = iVar64 + 2) {
                    uVar23 = (uint)local_1b0.c[lVar35 * 4 + lVar37] + iVar64;
                    if ((-1 < (int)uVar23) && ((int)uVar23 <= (int)(&DAT_0019557c)[lVar37])) {
                      aVar24.m_u32._1_3_ = 0;
                      aVar24.field_0.r = puVar41[uVar23];
                      (&local_218)[lVar35] = aVar24;
                      local_210 = (local_214 + local_218.m_u32 * 2) / 3;
                      local_20c = (local_218.m_u32 + local_214 * 2) / 3;
                      uVar25 = 0;
                      uVar33 = 0;
                      do {
                        if (uVar34 == uVar25) break;
                        iVar39 = (&local_218)[pSelectors[uVar25]].m_u32 -
                                 (uint)pcVar43[uVar25].field_0.field_0.r;
                        uVar33 = uVar33 + (uint)(iVar39 * iVar39);
                        uVar25 = uVar25 + 1;
                      } while (uVar33 < *(ulong *)(max + lVar37 * 2));
                      if (uVar33 < *(ulong *)(max + lVar37 * 2)) {
                        local_1b0.c[lVar35 * 4 + lVar37] = (uchar)uVar23;
                        local_140.c[lVar35 * 4 + lVar37] = local_218.c[lVar35 * 4];
                        if (lVar35 == 0) {
                          uVar21 = dxt1_block::pack_color
                                             ((color_quad_u8 *)&local_1b0.field_0,false,0x7f);
                          uVar22 = (uint)uVar21;
                          *low16 = uVar22;
                          uVar30 = *high16;
                        }
                        else {
                          uVar21 = dxt1_block::pack_color
                                             ((color_quad_u8 *)&local_1ac.field_0,false,0x7f);
                          uVar30 = (uint)uVar21;
                          *high16 = (uint)uVar21;
                          uVar22 = *low16;
                        }
                        determine_selectors(n,block,uVar22,uVar30,pSelectors);
                        eval_colors(color,*low16,*high16);
                        register0x00000030 = 0;
                        lVar31 = 0;
                        for (uVar34 = 0; local_120 != uVar34; uVar34 = uVar34 + 1) {
                          iVar39 = (uint)block[uVar34].field_0.field_0.r -
                                   (uint)color[pSelectors[uVar34]].field_0.field_0.r;
                          lVar31 = lVar31 + (ulong)(uint)(iVar39 * iVar39);
                          iVar39 = (uint)block[uVar34].field_0.field_0.g -
                                   (uint)color[pSelectors[uVar34]].field_0.field_0.g;
                          register0x00000030 = register0x00000030 + (ulong)(uint)(iVar39 * iVar39);
                        }
                        max[0] = (int)lVar31;
                        max[1] = (int)((ulong)lVar31 >> 0x20);
                        bVar28 = true;
                        puVar41 = local_208;
                        uVar34 = local_120;
                      }
                    }
                  }
                }
              }
              pcVar43 = (color_quad_u8 *)((long)&pcVar43->field_0 + 1);
            }
            iVar36 = iVar36 + 1;
            bVar44 = true;
          } while (bVar28);
          if (bVar20) {
            uVar27 = determine_error(n,block,*low16,*high16,0xffffffffffffffff);
            bVar44 = uVar27 == 0;
          }
          else {
            bVar44 = (char)local_138 == '\0';
          }
          if (bVar44) break;
        }
      }
      goto LAB_001652ca;
    }
  }
  compress_solid_block(n,ave_color,low16,high16,pSelectors);
LAB_001652ca:
  uVar23 = *low16;
  if (uVar23 < *high16) {
    *low16 = *high16;
    *high16 = uVar23;
    for (uVar33 = 0; uVar34 != uVar33; uVar33 = uVar33 + 1) {
      pSelectors[uVar33] = pSelectors[uVar33] ^ 1;
    }
  }
  return;
}

Assistant:

void compress_color_block(uint n, const color_quad_u8* block, uint& low16, uint& high16, uint8* pSelectors, bool refine) {
  CRNLIB_ASSERT((n & 15) == 0);

  uint ave_color[3];
  float axis[3];

  if (!optimize_block_colors(n, block, low16, high16, ave_color, axis)) {
    compress_solid_block(n, ave_color, low16, high16, pSelectors);
  } else {
    if (!determine_selectors(n, block, low16, high16, pSelectors))
      compress_solid_block(n, ave_color, low16, high16, pSelectors);
    else {
      if (refine_block(n, block, low16, high16, pSelectors))
        determine_selectors(n, block, low16, high16, pSelectors);

      if (refine)
        refine_endpoints2(n, block, low16, high16, pSelectors, axis);
    }
  }

  if (low16 < high16) {
    utils::swap(low16, high16);
    for (uint i = 0; i < n; i++)
      pSelectors[i] ^= 1;
  }
}